

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setAddress(QHostAddress *this,Q_IPV6ADDR *ip6Addr)

{
  QHostAddressPrivate *in_RSI;
  Q_IPV6ADDR *in_RDI;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)in_RSI);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216d89);
  QHostAddressPrivate::setAddress(in_RSI,in_RDI);
  return;
}

Assistant:

void QHostAddress::setAddress(const Q_IPV6ADDR &ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}